

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O3

bool __thiscall node::anon_unknown_2::NodeImpl::baseInitialize(NodeImpl *this)

{
  _Head_base<0UL,_kernel::Context_*,_false> _Var1;
  bool bVar2;
  ArgsManager *pAVar3;
  undefined4 extraout_var;
  NodeContext **ppNVar4;
  Warnings *this_00;
  _Head_base<0UL,_kernel::Context_*,_false> this_01;
  ECC_Context *this_02;
  pointer __p;
  long in_FS_OFFSET;
  __uniq_ptr_impl<node::Warnings,_std::default_delete<node::Warnings>_> local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pAVar3 = args(this);
  local_28._M_t.super__Tuple_impl<0UL,_node::Warnings_*,_std::default_delete<node::Warnings>_>.
  super__Head_base<0UL,_node::Warnings_*,_false>._M_head_impl._0_4_ =
       (*(this->super_Node)._vptr_Node[0x3d])(this);
  local_28._M_t.super__Tuple_impl<0UL,_node::Warnings_*,_std::default_delete<node::Warnings>_>.
  super__Head_base<0UL,_node::Warnings_*,_false>._M_head_impl._4_4_ = extraout_var;
  ppNVar4 = inline_assertion_check<true,node::NodeContext*>
                      ((NodeContext **)&local_28,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/interfaces.cpp"
                       ,0x6e,"baseInitialize","context()");
  bVar2 = AppInitBasicSetup(pAVar3,&(*ppNVar4)->exit_status);
  if (bVar2) {
    pAVar3 = args(this);
    bVar2 = AppInitParameterInteraction(pAVar3);
    if (bVar2) {
      this_00 = (Warnings *)operator_new(0x58);
      Warnings::Warnings(this_00);
      local_28._M_t.super__Tuple_impl<0UL,_node::Warnings_*,_std::default_delete<node::Warnings>_>.
      super__Head_base<0UL,_node::Warnings_*,_false>._M_head_impl =
           (tuple<node::Warnings_*,_std::default_delete<node::Warnings>_>)
           (_Tuple_impl<0UL,_node::Warnings_*,_std::default_delete<node::Warnings>_>)0x0;
      std::__uniq_ptr_impl<node::Warnings,_std::default_delete<node::Warnings>_>::reset
                ((__uniq_ptr_impl<node::Warnings,_std::default_delete<node::Warnings>_> *)
                 &this->m_context->warnings,this_00);
      std::unique_ptr<node::Warnings,_std::default_delete<node::Warnings>_>::~unique_ptr
                ((unique_ptr<node::Warnings,_std::default_delete<node::Warnings>_> *)&local_28);
      this_01._M_head_impl = (Context *)operator_new(1);
      kernel::Context::Context(this_01._M_head_impl);
      _Var1._M_head_impl =
           (this->m_context->kernel)._M_t.
           super___uniq_ptr_impl<kernel::Context,_std::default_delete<kernel::Context>_>._M_t.
           super__Tuple_impl<0UL,_kernel::Context_*,_std::default_delete<kernel::Context>_>.
           super__Head_base<0UL,_kernel::Context_*,_false>._M_head_impl;
      (this->m_context->kernel)._M_t.
      super___uniq_ptr_impl<kernel::Context,_std::default_delete<kernel::Context>_>._M_t.
      super__Tuple_impl<0UL,_kernel::Context_*,_std::default_delete<kernel::Context>_>.
      super__Head_base<0UL,_kernel::Context_*,_false>._M_head_impl = this_01._M_head_impl;
      if (_Var1._M_head_impl != (Context *)0x0) {
        operator_delete(_Var1._M_head_impl,1);
      }
      this_02 = (ECC_Context *)operator_new(1);
      ECC_Context::ECC_Context(this_02);
      local_28._M_t.super__Tuple_impl<0UL,_node::Warnings_*,_std::default_delete<node::Warnings>_>.
      super__Head_base<0UL,_node::Warnings_*,_false>._M_head_impl =
           (tuple<node::Warnings_*,_std::default_delete<node::Warnings>_>)
           (_Tuple_impl<0UL,_node::Warnings_*,_std::default_delete<node::Warnings>_>)0x0;
      std::__uniq_ptr_impl<ECC_Context,_std::default_delete<ECC_Context>_>::reset
                ((__uniq_ptr_impl<ECC_Context,_std::default_delete<ECC_Context>_> *)
                 &this->m_context->ecc_context,this_02);
      std::unique_ptr<ECC_Context,_std::default_delete<ECC_Context>_>::~unique_ptr
                ((unique_ptr<ECC_Context,_std::default_delete<ECC_Context>_> *)&local_28);
      bVar2 = AppInitSanityChecks((this->m_context->kernel)._M_t.
                                  super___uniq_ptr_impl<kernel::Context,_std::default_delete<kernel::Context>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_kernel::Context_*,_std::default_delete<kernel::Context>_>
                                  .super__Head_base<0UL,_kernel::Context_*,_false>._M_head_impl);
      if (bVar2) {
        bVar2 = AppInitLockDataDirectory();
        if (bVar2) {
          bVar2 = AppInitInterfaces(this->m_context);
          goto LAB_002535bc;
        }
      }
    }
  }
  bVar2 = false;
LAB_002535bc:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool baseInitialize() override
    {
        if (!AppInitBasicSetup(args(), Assert(context())->exit_status)) return false;
        if (!AppInitParameterInteraction(args())) return false;

        m_context->warnings = std::make_unique<node::Warnings>();
        m_context->kernel = std::make_unique<kernel::Context>();
        m_context->ecc_context = std::make_unique<ECC_Context>();
        if (!AppInitSanityChecks(*m_context->kernel)) return false;

        if (!AppInitLockDataDirectory()) return false;
        if (!AppInitInterfaces(*m_context)) return false;

        return true;
    }